

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFEFStreamObjectHelper::getParam(QPDFEFStreamObjectHelper *this,string *pkey)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle params;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pkey->field_2)._M_allocated_capacity;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_58 + 0x10));
  local_38._M_allocated_capacity = (size_type)local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/Params","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_58,(string *)(local_58 + 0x10));
  if ((long *)local_38._M_allocated_capacity != local_28) {
    operator_delete((void *)local_38._M_allocated_capacity,local_28[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._24_8_);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_58);
  if (bVar1) {
    QVar3 = QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_58);
    _Var2._M_pi = QVar3.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    QVar3 = QPDFObjectHandle::newNull();
    _Var2._M_pi = QVar3.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var2._M_pi = extraout_RDX;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFEFStreamObjectHelper::getParam(std::string const& pkey)
{
    auto params = oh().getDict().getKey("/Params");
    if (params.isDictionary()) {
        return params.getKey(pkey);
    }
    return QPDFObjectHandle::newNull();
}